

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_node_counts
          (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,node_type_counter_array *expected_node_counts)

{
  array<unsigned_long,_5UL> *container;
  ElementsAreArrayMatcher<unsigned_long> *matcher;
  char *message;
  stringstream local_210 [8];
  stringstream dump_sink;
  ostream local_200 [376];
  undefined1 local_88 [8];
  node_type_counter_array actual_node_counts;
  char local_48 [8];
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  std::__cxx11::stringstream::stringstream(local_210);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
            (&this->test_db,local_200);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((node_type_counter_array *)local_88,&this->test_db);
  testing::ElementsAreArray<std::array<unsigned_long,5ul>>
            ((ElementsAreArrayMatcher<unsigned_long> *)(actual_node_counts._M_elems + 4),
             (testing *)expected_node_counts,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>
              *)&gtest_ar.message_,(internal *)(actual_node_counts._M_elems + 4),matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_48,(char *)&gtest_ar.message_,(array<unsigned_long,_5UL> *)"(actual_node_counts)"
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar.message_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             (actual_node_counts._M_elems + 4));
  if (local_48[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2bf,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::stringstream::~stringstream(local_210);
  return;
}

Assistant:

void assert_node_counts(
      const node_type_counter_array &expected_node_counts) const {
    // Dump the tree to a string. Do not attempt to check the dump format, only
    // that dumping does not crash
    std::stringstream dump_sink;
    test_db.dump(dump_sink);

    const auto actual_node_counts = test_db.get_node_counts();
    UNODB_ASSERT_THAT(actual_node_counts,
                      ::testing::ElementsAreArray(expected_node_counts));
  }